

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

int skipcomment(FILE *f,int *cp)

{
  int iVar1;
  bool local_25;
  int c;
  int *cp_local;
  FILE *f_local;
  
  iVar1 = skipBOM(f);
  *cp = iVar1;
  if (iVar1 == 0x23) {
    do {
      iVar1 = getc((FILE *)f);
      local_25 = iVar1 != -1 && iVar1 != 10;
    } while (local_25);
    iVar1 = getc((FILE *)f);
    *cp = iVar1;
    f_local._4_4_ = 1;
  }
  else {
    f_local._4_4_ = 0;
  }
  return f_local._4_4_;
}

Assistant:

static int skipcomment (FILE *f, int *cp) {
  int c = *cp = skipBOM(f);
  if (c == '#') {  /* first line is a comment (Unix exec. file)? */
    do {  /* skip first line */
      c = getc(f);
    } while (c != EOF && c != '\n');
    *cp = getc(f);  /* next character after comment, if present */
    return 1;  /* there was a comment */
  }
  else return 0;  /* no comment */
}